

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz.c
# Opt level: O3

void sz_boot(sc_data_t *sc_data)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  
  iVar4 = 0;
  lVar6 = 0x5c;
  do {
    if (*(char *)((long)sc_data->sc + lVar6 + -0x4c) == '\x01') {
      sz_pind2sz_tab[iVar4] =
           ((long)*(int *)((long)sc_data->sc + lVar6 + -0x50) <<
           (*(byte *)((long)(sc_data->sc + -3) + lVar6) & 0x3f)) +
           (1L << (*(byte *)((long)sc_data->sc + lVar6 + -0x58) & 0x3f));
      iVar4 = iVar4 + 1;
    }
    lVar6 = lVar6 + 0x1c;
  } while (lVar6 != 0x19bc);
  if (iVar4 < 200) {
    iVar5 = iVar4 + -200;
    do {
      sz_pind2sz_tab[iVar4] = sc_data->large_maxclass + 0x1000;
      iVar5 = iVar5 + 1;
    } while (iVar5 != 0);
  }
  piVar1 = &sc_data->sc[0].ndelta;
  lVar6 = 0;
  do {
    sz_index2size_tab[lVar6] =
         ((long)*piVar1 << ((byte)piVar1[-1] & 0x3f)) + (1L << ((byte)piVar1[-2] & 0x3f));
    lVar6 = lVar6 + 1;
    piVar1 = piVar1 + 7;
  } while (lVar6 != 0xe8);
  piVar1 = &sc_data->sc[0].ndelta;
  uVar8 = 0;
  uVar7 = 0;
  while( true ) {
    uVar2 = (1L << ((byte)piVar1[-2] & 0x3f)) + ((long)*piVar1 << ((byte)piVar1[-1] & 0x3f)) + 7U >>
            3;
    uVar3 = uVar2 - uVar7;
    if (uVar7 <= uVar2) {
      uVar2 = 0;
      if (uVar7 < 0x201) {
        uVar2 = 0x200 - uVar7;
      }
      if (uVar3 <= uVar2) {
        uVar2 = uVar3;
      }
      memset(sz_size2index_tab + uVar7,(int)uVar8,uVar2 + 1);
      uVar7 = uVar7 + uVar2 + 1;
    }
    if (0xe6 < uVar8) break;
    uVar8 = uVar8 + 1;
    piVar1 = piVar1 + 7;
    if (0x200 < uVar7) {
      return;
    }
  }
  return;
}

Assistant:

void
sz_boot(const sc_data_t *sc_data) {
	sz_boot_pind2sz_tab(sc_data);
	sz_boot_index2size_tab(sc_data);
	sz_boot_size2index_tab(sc_data);
}